

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

float * Gia_ManGenerateDelayTableFloat(int nIns,int nOuts)

{
  float *pfVar1;
  float *pDelayTable;
  int Total;
  int i;
  int nOuts_local;
  int nIns_local;
  
  pfVar1 = (float *)malloc((long)(nIns * nOuts + 3) << 2);
  *pfVar1 = 0.0;
  pfVar1[1] = (float)nIns;
  pfVar1[2] = (float)nOuts;
  for (pDelayTable._4_4_ = 0; pDelayTable._4_4_ < nIns * nOuts;
      pDelayTable._4_4_ = pDelayTable._4_4_ + 1) {
    pfVar1[pDelayTable._4_4_ + 3] = 1.0;
  }
  pfVar1[(pDelayTable._4_4_ + 3) - nIns] = -1e+09;
  return pfVar1;
}

Assistant:

float * Gia_ManGenerateDelayTableFloat( int nIns, int nOuts )
{
    int i, Total = nIns * nOuts;
    float * pDelayTable = ABC_ALLOC( float, Total + 3 );
    pDelayTable[0] = 0;
    pDelayTable[1] = nIns;
    pDelayTable[2] = nOuts;
    for ( i = 0; i < Total; i++ )
        pDelayTable[i+3] = 1;
    pDelayTable[i+3 - nIns] = -ABC_INFINITY;
    return pDelayTable;
}